

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O1

void __thiscall KDIS::KDataStream::Write<short>(KDataStream *this,short T)

{
  long lVar1;
  short *psVar2;
  KUINT8 i;
  NetToDataType<short> OctArray;
  KOCTET Temp [2];
  uchar local_1d;
  short local_1c;
  short local_1a;
  
  local_1c = T;
  if (this->m_MachineEndian != this->m_NetEndian) {
    local_1a = T;
    lVar1 = 1;
    psVar2 = &local_1c;
    do {
      *(undefined1 *)psVar2 = *(undefined1 *)((long)&local_1a + lVar1);
      psVar2 = (short *)((long)psVar2 + 1);
      lVar1 = lVar1 + -1;
    } while (lVar1 == 0);
  }
  lVar1 = 0;
  do {
    local_1d = *(uchar *)((long)&local_1c + lVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_vBuffer,&local_1d);
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}